

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressBar.c
# Opt level: O0

void printProgressBar(_Bool *running,int *error,progress_t *p)

{
  uint64_t uVar1;
  uint64_t uVar2;
  unsigned_short uVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int local_50;
  int i;
  int bar;
  double ratio;
  uint16_t bar_size;
  size_t term_width;
  uint8_t count;
  char *action;
  progress_t *p_local;
  int *error_local;
  _Bool *running_local;
  
  pcVar5 = "Decrypting";
  if ((p->encrypt & 1U) != 0) {
    pcVar5 = "Encrypting";
  }
  term_width._7_1_ = 0;
  iVar4 = ioctl(1,0x5413,&printProgressBar::ws);
  uVar3 = printProgressBar::ws.ws_col;
  if (iVar4 < 0) {
    uVar3 = 0x50;
  }
  _i = 0.0;
  while( true ) {
    bVar6 = false;
    if (((*running & 1U) != 0) && (bVar6 = false, *error == 0)) {
      bVar6 = p->progress < p->operations;
    }
    if (!bVar6) break;
    iVar4 = pthread_mutex_trylock((pthread_mutex_t *)p->progress_mutex);
    if (iVar4 == 0) {
      uVar1 = p->progress;
      auVar7._8_4_ = (int)(uVar1 >> 0x20);
      auVar7._0_8_ = uVar1;
      auVar7._12_4_ = 0x45300000;
      uVar2 = p->operations;
      auVar8._8_4_ = (int)(uVar2 >> 0x20);
      auVar8._0_8_ = uVar2;
      auVar8._12_4_ = 0x45300000;
      _i = ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
      pthread_mutex_unlock((pthread_mutex_t *)p->progress_mutex);
    }
    else {
      nanosleep((timespec *)&printProgressBar::sleep_interval,(timespec *)0x0);
    }
    printf("%s[",pcVar5);
    iVar4 = (int)(_i * (double)(ushort)(uVar3 - 0x13));
    for (local_50 = 0; local_50 < (int)(uint)(ushort)(uVar3 - 0x13); local_50 = local_50 + 1) {
      if (local_50 < iVar4) {
        printf("#");
      }
      else if (local_50 == iVar4) {
        if (term_width._7_1_ == 0) {
          printf("|");
        }
        else if (term_width._7_1_ == 1) {
          printf("/");
        }
        else if (term_width._7_1_ == 2) {
          printf("-");
        }
        else if (term_width._7_1_ == 3) {
          printf("\\");
        }
      }
      else {
        printf(" ");
      }
    }
    printf("]%.2f%%\r",_i * 100.0);
    fflush(_stdout);
    term_width._7_1_ = (byte)((ulong)(term_width._7_1_ + 1) % 4);
  }
  return;
}

Assistant:

void printProgressBar(bool* running, int* error, progress_t* p)
{
    const char* action = p->encrypt ? "Encrypting" : "Decrypting";
    uint8_t count = 0;
    static struct winsize ws;
    const size_t term_width = ioctl(1, TIOCGWINSZ, &ws) >= 0 ? ws.ws_col : STD_TERM_WIDTH;
    const uint16_t bar_size = term_width - SUBTRACT_SIZE;
    double ratio = 0.0;
    const static struct timespec sleep_interval = { .tv_sec = 0, .tv_nsec = 50000000 }; //interval for nanosleep

    while(*(running) && *(error) == 0 && p->progress < p->operations)
    {
	    if(pthread_mutex_trylock(p->progress_mutex) == 0)
        {
            ratio = ((double)p->progress/(double)p->operations);
            //sleep the progress bar so the program can do some work
            //TODO figure out what header nanosleep is declared in if not <time.h>
	        pthread_mutex_unlock(p->progress_mutex);
        }
        else { nanosleep(&sleep_interval, (struct timespec *)NULL); }

    	printf("%s[", action);

        int bar = ratio * bar_size;
	    for(int i=0; i<bar_size; ++i)
	    { 
	        if(i<bar) { printf("#"); } //use # as the solid part of the progress bar
	        else if(i == bar)
            {
	            //spin the cursor so that the user feels like something is happening
	            if(count == 0) printf("|");
	            else if(count == 1) printf("/");
	            else if(count == 2) printf("-");
	            else if(count == 3) printf("\\");
	        }
	        else { printf(" "); }
        }
        printf("]%.2f%%\r", ratio*100);
        fflush(stdout);
	    count = (count+1)%4;
    }
}